

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O1

GLMRegressor * __thiscall CoreML::Specification::GLMRegressor::New(GLMRegressor *this,Arena *arena)

{
  GLMRegressor *this_00;
  
  this_00 = (GLMRegressor *)operator_new(0x48);
  GLMRegressor(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GLMRegressor>(arena,this_00);
  }
  return this_00;
}

Assistant:

GLMRegressor* GLMRegressor::New(::google::protobuf::Arena* arena) const {
  GLMRegressor* n = new GLMRegressor;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}